

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

string * int_to_string_base_internal<long_long>
                   (string *__return_storage_ptr__,longlong num,int base,int length)

{
  logic_error *this;
  ostream *this_00;
  void *this_01;
  size_t sVar1;
  int local_230;
  int local_22c;
  unsigned_long local_228;
  int local_220;
  undefined1 local_219;
  int str_length;
  int local_1f4;
  locale local_1f0 [8];
  ostringstream local_1e8 [8];
  ostringstream buf;
  string local_70;
  string local_50 [8];
  string cvt;
  int length_local;
  int base_local;
  longlong num_local;
  string *result;
  
  if (((base != 8) && (base != 10)) && (base != 0x10)) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"int_to_string_base called with unsupported base");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::string::string(local_50);
  if (base == 10) {
    std::__cxx11::to_string(&local_70,num);
    std::__cxx11::string::operator=(local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    std::locale::classic();
    std::ios::imbue(local_1f0);
    std::locale::~locale(local_1f0);
    local_1f4 = (int)std::setbase(base);
    this_00 = std::operator<<((ostream *)local_1e8,(_Setbase)local_1f4);
    this_01 = (void *)std::ostream::operator<<(this_00,std::nouppercase);
    std::ostream::operator<<(this_01,num);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(local_50,(string *)&str_length);
    std::__cxx11::string::~string((string *)&str_length);
    std::__cxx11::ostringstream::~ostringstream(local_1e8);
  }
  local_219 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_228 = std::__cxx11::string::length();
  local_220 = QIntC::to_int<unsigned_long>(&local_228);
  if ((0 < length) && (local_220 < length)) {
    local_22c = length - local_220;
    sVar1 = QIntC::to_size<int>(&local_22c);
    std::__cxx11::string::append((ulong)__return_storage_ptr__,(char)sVar1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_50);
  if ((length < 0) && (SBORROW4(local_220,-length) != local_220 + length < 0)) {
    local_230 = -(length + local_220);
    sVar1 = QIntC::to_size<int>(&local_230);
    std::__cxx11::string::append((ulong)__return_storage_ptr__,(char)sVar1);
  }
  local_219 = 1;
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

static std::string
int_to_string_base_internal(T num, int base, int length)
{
    // Backward compatibility -- int_to_string, which calls this function, used to use sprintf with
    // %0*d, so we interpret length such that a negative value appends spaces and a positive value
    // prepends zeroes.
    if (!((base == 8) || (base == 10) || (base == 16))) {
        throw std::logic_error("int_to_string_base called with unsupported base");
    }
    std::string cvt;
    if (base == 10) {
        // Use the more efficient std::to_string when possible
        cvt = std::to_string(num);
    } else {
        std::ostringstream buf;
        buf.imbue(std::locale::classic());
        buf << std::setbase(base) << std::nouppercase << num;
        cvt = buf.str();
    }
    std::string result;
    int str_length = QIntC::to_int(cvt.length());
    if ((length > 0) && (str_length < length)) {
        result.append(QIntC::to_size(length - str_length), '0');
    }
    result += cvt;
    if ((length < 0) && (str_length < -length)) {
        result.append(QIntC::to_size(-length - str_length), ' ');
    }
    return result;
}